

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionProfile.cpp
# Opt level: O1

region_profile_t * __thiscall
cali::RegionProfile::exclusive_region_times
          (region_profile_t *__return_storage_ptr__,RegionProfile *this,string *region_type)

{
  int iVar1;
  ostream *this_00;
  _Rb_tree_node_base *p_Var2;
  FlatExclusiveRegionProfile rp;
  Channel chn;
  Caliper c;
  FlatExclusiveRegionProfile FStack_288;
  Channel local_278;
  _Any_data local_268;
  code *local_258;
  Caliper local_248;
  undefined1 local_228 [248];
  ios_base local_130 [264];
  int local_28;
  
  Caliper::Caliper(&local_248);
  ChannelController::channel(&this->super_ChannelController);
  FlatExclusiveRegionProfile::FlatExclusiveRegionProfile
            (&FStack_288,&local_248.super_CaliperMetadataAccessInterface,"sum#time.duration.ns",
             (region_type->_M_dataplus)._M_p);
  if ((local_278.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
     ((local_278.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count < 1)) {
    this_00 = (ostream *)local_228;
    std::ofstream::ofstream(this_00);
    local_28 = 1;
    iVar1 = Log::verbosity();
    if (local_28 <= iVar1) {
      this_00 = Log::get_stream((Log *)local_228);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (this_00,"RegionProfile::exclusive_region_times(): channel is not enabled",0x3f);
    std::ios::widen((char)*(undefined8 *)(*(long *)this_00 + -0x18) + (char)this_00);
    std::ostream::put((char)this_00);
    std::ostream::flush();
    local_228._0_8_ = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_228 + 8));
    std::ios_base::~ios_base(local_130);
  }
  else {
    std::
    function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
    ::function<cali::FlatExclusiveRegionProfile&,void>
              ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                *)local_268._M_pod_data,&FStack_288);
    Caliper::flush(&local_248,
                   local_278.mP.super___shared_ptr<cali::ChannelBody,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(SnapshotView)ZEXT816(0),(SnapshotFlushFn *)&local_268);
    if (local_258 != (code *)0x0) {
      (*local_258)(&local_268,&local_268,__destroy_functor);
    }
  }
  FlatExclusiveRegionProfile::result_abi_cxx11_(__return_storage_ptr__,&FStack_288);
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
  ).super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl =
       (__return_storage_ptr__->
       super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
       ).super__Tuple_impl<1UL,_double,_double>.super__Head_base<1UL,_double,_false>._M_head_impl *
       1e-09;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
  ).super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
  super__Head_base<2UL,_double,_false>._M_head_impl =
       (__return_storage_ptr__->
       super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
       ).super__Tuple_impl<1UL,_double,_double>.super__Tuple_impl<2UL,_double>.
       super__Head_base<2UL,_double,_false>._M_head_impl * 1e-09;
  for (p_Var2 = *(_Base_ptr *)
                 ((long)&(__return_storage_ptr__->
                         super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
                         ).
                         super__Head_base<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_false>
                         ._M_head_impl._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var2 !=
      &(__return_storage_ptr__->
       super__Tuple_impl<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
       ).
       super__Head_base<0UL,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_false>
       ._M_head_impl._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    *(double *)(p_Var2 + 2) = *(double *)(p_Var2 + 2) * 1e-09;
  }
  if (FStack_288.mP.
      super___shared_ptr<cali::FlatExclusiveRegionProfile::FlatExclusiveRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (FStack_288.mP.
               super___shared_ptr<cali::FlatExclusiveRegionProfile::FlatExclusiveRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  Channel::~Channel(&local_278);
  return __return_storage_ptr__;
}

Assistant:

RegionProfile::region_profile_t RegionProfile::exclusive_region_times(const std::string& region_type)
{
    Caliper                    c;
    Channel                    chn = channel();
    FlatExclusiveRegionProfile rp(c, "sum#time.duration.ns", region_type.c_str());

    if (chn)
        c.flush(chn.body(), SnapshotView(), rp);
    else
        Log(1).stream() << "RegionProfile::exclusive_region_times(): channel is not enabled" << std::endl;

    auto res = rp.result();

    // convert from nanosec to sec
    std::get<1>(res) *= 1e-9;
    std::get<2>(res) *= 1e-9;
    for (auto& p : std::get<0>(res))
        p.second *= 1e-9;

    return res;
}